

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineReader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::InlineReader::DoClose(InlineReader *this,int transportIndex)

{
  int iVar1;
  ostream *poVar2;
  long in_RDI;
  ScopedTimer __var2233;
  void *in_stack_ffffffffffffffa8;
  ostream *in_stack_ffffffffffffffb0;
  
  if (DoClose(int)::__var233 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoClose(int)::__var233);
    if (iVar1 != 0) {
      DoClose::__var233 = (void *)ps_timer_create_("InlineReader::DoClose");
      __cxa_guard_release(&DoClose(int)::__var233);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (*(int *)(in_RDI + 0xc0) == 5) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Inline Reader ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0xc4));
    in_stack_ffffffffffffffb0 = std::operator<<(poVar2," Close(");
    poVar2 = std::operator<<(in_stack_ffffffffffffffb0,(string *)(in_RDI + 0x30));
    std::operator<<(poVar2,")\n");
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void InlineReader::DoClose(const int transportIndex)
{
    PERFSTUBS_SCOPED_TIMER("InlineReader::DoClose");
    if (m_Verbosity == 5)
    {
        std::cout << "Inline Reader " << m_ReaderRank << " Close(" << m_Name << ")\n";
    }
}